

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

WebAssemblyModule * __thiscall Wasm::WasmModuleGenerator::GenerateModule(WasmModuleGenerator *this)

{
  byte bVar1;
  SourceContextInfo *this_00;
  WebAssemblyModule *pWVar2;
  code *pcVar3;
  byte bVar4;
  bool bVar5;
  BOOLEAN BVar6;
  uint32 initialFunctionCount;
  uint uVar7;
  LocalFunctionId LVar8;
  uint32 index_00;
  LocalFunctionId LVar9;
  WasmBinaryReader *pWVar10;
  SRCINFO *this_01;
  SourceContextInfo **ppSVar11;
  WasmFunctionInfo *this_02;
  FunctionBody *pFVar12;
  undefined4 *puVar13;
  WasmSignature *sig;
  WasmCompilationException *pWVar14;
  undefined1 local_478 [8];
  CmdLineArgsParser parser;
  char16 *argv [4];
  char16 offLoopJit [128];
  char16 offSimpleJit [128];
  char16 offFullJit [128];
  char16 range [64];
  int sourceId;
  WasmFunctionInfo *newInfo;
  uint32 index;
  WasmFunctionInfo *info;
  WasmFunctionInfo *pWStack_90;
  uint32 i_1;
  WasmFunctionInfo *lastThunk;
  WasmFunctionInfo *firstThunk;
  uint32 i;
  SourceContextInfo *sourceContextInfo;
  uint32 funcCount;
  SectionCode precedent;
  SectionCode sectionCode;
  SectionHeader sectionHeader;
  SectionCode nextExpectedSection;
  BVStatic<14UL> visitedSections;
  undefined1 local_20 [8];
  AutoProfilingPhase wasmPhase;
  WasmModuleGenerator *this_local;
  
  wasmPhase._8_8_ = this;
  Js::AutoProfilingPhase::AutoProfilingPhase
            ((AutoProfilingPhase *)local_20,this->m_scriptContext,WasmReaderPhase);
  pWVar10 = Js::WebAssemblyModule::GetReader(this->m_module);
  WasmBinaryReader::InitializeReader(pWVar10);
  BVStatic<14UL>::BVStatic((BVStatic<14UL> *)&stack0xffffffffffffffc8);
  sectionHeader.name._7_1_ = 0;
  do {
    pWVar10 = GetReader(this);
    WasmBinaryReader::ReadNextSection((SectionHeader *)&funcCount,pWVar10);
    bVar4 = (byte)funcCount;
    if ((byte)funcCount == 0xd) {
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,WasmSectionPhase);
      if (bVar5) {
        Output::Print(L"Done reading module\'s sections");
        Output::Print(L"\n");
        Output::Flush();
      }
      initialFunctionCount = Js::WebAssemblyModule::GetWasmFunctionCount(this->m_module);
      this_01 = Js::Utf8SourceInfo::GetSrcInfo(this->m_sourceInfo);
      ppSVar11 = Memory::WriteBarrierPtr::operator_cast_to_SourceContextInfo__
                           ((WriteBarrierPtr *)this_01);
      this_00 = *ppSVar11;
      Js::Utf8SourceInfo::EnsureInitialized(this->m_sourceInfo,initialFunctionCount);
      this_00->nextLocalFunctionId = this_00->nextLocalFunctionId + initialFunctionCount;
      SourceContextInfo::EnsureInitialized(this_00);
      for (firstThunk._4_4_ = 0; firstThunk._4_4_ < initialFunctionCount;
          firstThunk._4_4_ = firstThunk._4_4_ + 1) {
        GenerateFunctionHeader(this,firstThunk._4_4_);
      }
      lastThunk = (WasmFunctionInfo *)0x0;
      pWStack_90 = (WasmFunctionInfo *)0x0;
      for (info._4_4_ = 0; info._4_4_ < initialFunctionCount; info._4_4_ = info._4_4_ + 1) {
        this_02 = Js::WebAssemblyModule::GetWasmFunctionInfo(this->m_module,info._4_4_);
        pFVar12 = WasmFunctionInfo::GetBody(this_02);
        if (pFVar12 == (FunctionBody *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                             ,0x13a,"(info->GetBody())","info->GetBody()");
          if (!bVar5) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
        pFVar12 = WasmFunctionInfo::GetBody(this_02);
        uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar12);
        pFVar12 = WasmFunctionInfo::GetBody(this_02);
        LVar8 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar12);
        bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,WasmInOutPhase,uVar7,LVar8);
        if (bVar5) {
          index_00 = Js::WebAssemblyModule::GetWasmFunctionCount(this->m_module);
          pWVar2 = this->m_module;
          sig = WasmFunctionInfo::GetSignature(this_02);
          pWStack_90 = Js::WebAssemblyModule::AddWasmFunctionInfo(pWVar2,sig);
          if (lastThunk == (WasmFunctionInfo *)0x0) {
            lastThunk = pWStack_90;
          }
          GenerateFunctionHeader(this,index_00);
          Js::WebAssemblyModule::SwapWasmFunctionInfo(this->m_module,info._4_4_,index_00);
          Js::WebAssemblyModule::AttachCustomInOutTracingReader(this->m_module,pWStack_90,index_00);
        }
      }
      if (lastThunk != (WasmFunctionInfo *)0x0) {
        pFVar12 = WasmFunctionInfo::GetBody(lastThunk);
        uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar12);
        pFVar12 = WasmFunctionInfo::GetBody(lastThunk);
        LVar8 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar12);
        pFVar12 = WasmFunctionInfo::GetBody(pWStack_90);
        LVar9 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar12);
        swprintf_s((char16_t_conflict *)(offFullJit + 0x7c),0x40,(char16_t_conflict *)L"%d.%d-%d.%d"
                   ,(ulong)uVar7,(ulong)LVar8,(ulong)uVar7,LVar9);
        swprintf_s((char16_t_conflict *)(offSimpleJit + 0x7c),0x80,
                   (char16_t_conflict *)L"-off:fulljit:%s",offFullJit + 0x7c);
        swprintf_s((char16_t_conflict *)(offLoopJit + 0x7c),0x80,
                   (char16_t_conflict *)L"-off:simplejit:%s",offFullJit + 0x7c);
        swprintf_s((char16_t_conflict *)(argv + 3),0x80,(char16_t_conflict *)L"-off:jitloopbody:%s",
                   offFullJit + 0x7c);
        parser.pCustomConfigFlags = (ICustomConfigFlags *)0x0;
        argv[0] = offSimpleJit + 0x7c;
        argv[1] = offLoopJit + 0x7c;
        argv[2] = (char16 *)(argv + 3);
        CmdLineArgsParser::CmdLineArgsParser
                  ((CmdLineArgsParser *)local_478,(ICustomConfigFlags *)0x0,
                   (ConfigFlagsTable *)&Js::Configuration::Global);
        CmdLineArgsParser::Parse
                  ((CmdLineArgsParser *)local_478,4,(LPWSTR *)&parser.pCustomConfigFlags);
        CmdLineArgsParser::~CmdLineArgsParser((CmdLineArgsParser *)local_478);
      }
      BVar6 = BVStatic<14UL>::Test((BVStatic<14UL> *)&stack0xffffffffffffffc8,3);
      if ((BVar6 != '\0') &&
         (BVar6 = BVStatic<14UL>::Test((BVStatic<14UL> *)&stack0xffffffffffffffc8,10), BVar6 == '\0'
         )) {
        pWVar14 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (pWVar14,L"Missing required section: %s",SectionInfo::All._248_8_);
        __cxa_throw(pWVar14,&WasmCompilationException::typeinfo,
                    WasmCompilationException::~WasmCompilationException);
      }
      pWVar2 = this->m_module;
      Js::AutoProfilingPhase::~AutoProfilingPhase((AutoProfilingPhase *)local_20);
      return pWVar2;
    }
    bVar1 = SectionInfo::All[(ulong)(byte)funcCount * 0x18 + 4];
    if ((bVar1 != 0xd) &&
       (BVar6 = BVStatic<14UL>::Test((BVStatic<14UL> *)&stack0xffffffffffffffc8,(uint)bVar1),
       BVar6 == '\0')) {
      pWVar14 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (pWVar14,L"%s section missing before %s",
                 *(undefined8 *)(SectionInfo::All + (ulong)bVar1 * 0x18 + 8),sectionHeader._24_8_);
      __cxa_throw(pWVar14,&WasmCompilationException::typeinfo,
                  WasmCompilationException::~WasmCompilationException);
    }
    BVStatic<14UL>::Set((BVStatic<14UL> *)&stack0xffffffffffffffc8,(uint)bVar4);
    if (bVar4 != 0) {
      if (bVar4 < sectionHeader.name._7_1_) {
        pWVar14 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (pWVar14,L"Invalid Section %s",sectionHeader._24_8_);
        __cxa_throw(pWVar14,&WasmCompilationException::typeinfo,
                    WasmCompilationException::~WasmCompilationException);
      }
      sectionHeader.name._7_1_ = bVar4 + 1;
    }
    pWVar10 = GetReader(this);
    bVar5 = WasmBinaryReader::ProcessCurrentSection(pWVar10);
  } while (bVar5);
  pWVar14 = (WasmCompilationException *)__cxa_allocate_exception(8);
  WasmCompilationException::WasmCompilationException
            (pWVar14,L"Error while reading section %s",sectionHeader._24_8_);
  __cxa_throw(pWVar14,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
}

Assistant:

Js::WebAssemblyModule* WasmModuleGenerator::GenerateModule()
{
    Js::AutoProfilingPhase wasmPhase(m_scriptContext, Js::WasmReaderPhase);
    Unused(wasmPhase);

    m_module->GetReader()->InitializeReader();

    BVStatic<bSectLimit + 1> visitedSections;

    SectionCode nextExpectedSection = bSectCustom;
    while (true)
    {
        SectionHeader sectionHeader = GetReader()->ReadNextSection();
        SectionCode sectionCode = sectionHeader.code;
        if (sectionCode == bSectLimit)
        {
            TRACE_WASM(PHASE_TRACE1(Js::WasmSectionPhase), _u("Done reading module's sections"));
            break;
        }

        // Make sure dependency for this section has been seen
        SectionCode precedent = SectionInfo::All[sectionCode].precedent;
        if (precedent != bSectLimit && !visitedSections.Test(precedent))
        {
            throw WasmCompilationException(_u("%s section missing before %s"),
                SectionInfo::All[precedent].name,
                sectionHeader.name);
        }
        visitedSections.Set(sectionCode);

        // Custom section are allowed in any order
        if (sectionCode != bSectCustom)
        {
            if (sectionCode < nextExpectedSection)
            {
                throw WasmCompilationException(_u("Invalid Section %s"), sectionHeader.name);
            }
            nextExpectedSection = SectionCode(sectionCode + 1);
        }

        if (!GetReader()->ProcessCurrentSection())
        {
            throw WasmCompilationException(_u("Error while reading section %s"), sectionHeader.name);
        }
    }

    uint32 funcCount = m_module->GetWasmFunctionCount();
    SourceContextInfo * sourceContextInfo = m_sourceInfo->GetSrcInfo()->sourceContextInfo;
    m_sourceInfo->EnsureInitialized(funcCount);
    sourceContextInfo->nextLocalFunctionId += funcCount;
    sourceContextInfo->EnsureInitialized();

    for (uint32 i = 0; i < funcCount; ++i)
    {
        GenerateFunctionHeader(i);
    }

#if ENABLE_DEBUG_CONFIG_OPTIONS
    WasmFunctionInfo* firstThunk = nullptr, *lastThunk = nullptr;
    for (uint32 i = 0; i < funcCount; ++i)
    {
        WasmFunctionInfo* info = m_module->GetWasmFunctionInfo(i);
        Assert(info->GetBody());
        if (PHASE_TRACE(Js::WasmInOutPhase, info->GetBody()))
        {
            uint32 index = m_module->GetWasmFunctionCount();
            WasmFunctionInfo* newInfo = m_module->AddWasmFunctionInfo(info->GetSignature());
            if (!firstThunk)
            {
                firstThunk = newInfo;
            }
            lastThunk = newInfo;
            GenerateFunctionHeader(index);
            m_module->SwapWasmFunctionInfo(i, index);
            m_module->AttachCustomInOutTracingReader(newInfo, index);
        }
    }

    if (firstThunk)
    {
        int sourceId = (int)firstThunk->GetBody()->GetSourceContextId();
        char16 range[64];
        swprintf_s(range, 64, _u("%d.%d-%d.%d"),
                   sourceId, firstThunk->GetBody()->GetLocalFunctionId(),
                   sourceId, lastThunk->GetBody()->GetLocalFunctionId());
        char16 offFullJit[128];
        swprintf_s(offFullJit, 128, _u("-off:fulljit:%s"), range);
        char16 offSimpleJit[128];
        swprintf_s(offSimpleJit, 128, _u("-off:simplejit:%s"), range);
        char16 offLoopJit[128];
        swprintf_s(offLoopJit, 128, _u("-off:jitloopbody:%s"), range);
        char16* argv[] = { nullptr, offFullJit, offSimpleJit, offLoopJit };
        CmdLineArgsParser parser(nullptr);
        parser.Parse(ARRAYSIZE(argv), argv);
    }
#endif

    // If we see a FunctionSignatures section we need to see a FunctionBodies section
    if (visitedSections.Test(bSectFunction) && !visitedSections.Test(bSectFunctionBodies))
    {
        throw WasmCompilationException(_u("Missing required section: %s"), SectionInfo::All[bSectFunctionBodies].name);
    }

    return m_module;
}